

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::
Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::Vertex_iterator(Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *this,Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *simplex)

{
  (this->o_it_)._M_current =
       (simplex->partition_).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->o_end_)._M_current =
       (simplex->partition_).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<int,_std::allocator<int>_>::vector(&this->value_,&simplex->vertex_);
  this->is_end_ = (this->o_it_)._M_current == (this->o_end_)._M_current;
  return;
}

Assistant:

Vertex_iterator(const Permutahedral_representation& simplex)
      : o_it_(simplex.partition().begin()),
        o_end_(simplex.partition().end()),
        value_(simplex.vertex()),
        is_end_(o_it_ == o_end_) {}